

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O3

void __thiscall xe::xml::Tokenizer::advance(Tokenizer *this)

{
  uchar uVar1;
  Token TVar2;
  ulong uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  int iVar7;
  int iVar8;
  State SVar9;
  State SVar10;
  int iVar11;
  uint uVar12;
  Tokenizer *pTVar13;
  uchar *puVar14;
  uint uVar15;
  State SVar16;
  bool bVar17;
  string local_50;
  
  TVar2 = this->m_curToken;
  if (TVar2 < TOKEN_LAST) {
    if ((0x2a88U >> (TVar2 & 0x1f) & 1) != 0) {
      this->m_state = STATE_DATA;
      goto LAB_0011aa68;
    }
    if (TVar2 != TOKEN_INCOMPLETE) goto LAB_0011aa68;
    uVar12 = this->m_curTokenLen;
    if ((this->m_buf).m_numElements <= (int)uVar12) goto LAB_0011aac3;
LAB_0011aaa1:
    puVar14 = (this->m_buf).m_buffer;
    uVar4 = (this->m_buf).m_back;
    iVar11 = (this->m_buf).m_size;
    uVar15 = (uint)puVar14[(int)(uVar4 + uVar12) % iVar11];
  }
  else {
LAB_0011aa68:
    iVar11 = this->m_curTokenLen;
    iVar7 = ((this->m_buf).m_back + iVar11) % (this->m_buf).m_size;
    (this->m_buf).m_back = iVar7;
    iVar11 = (this->m_buf).m_numElements - iVar11;
    (this->m_buf).m_numElements = iVar11;
    this->m_curToken = TOKEN_INCOMPLETE;
    this->m_curTokenLen = 0;
    if (0 < iVar11) {
      if ((this->m_buf).m_buffer[iVar7] == '\0') {
        uVar5 = 0x100000001;
LAB_0011ad9b:
        this->m_curToken = (int)uVar5;
        this->m_curTokenLen = (int)((ulong)uVar5 >> 0x20);
        return;
      }
      uVar12 = 0;
      goto LAB_0011aaa1;
    }
    uVar12 = 0;
LAB_0011aac3:
    iVar11 = (this->m_buf).m_size;
    puVar14 = (this->m_buf).m_buffer;
    uVar4 = (this->m_buf).m_back;
    uVar15 = 0xffffffff;
  }
  uVar6 = (ulong)uVar4;
  SVar9 = this->m_state;
  iVar7 = (this->m_buf).m_numElements;
LAB_0011aaf3:
  SVar16 = SVar9;
  SVar10 = SVar9;
  while (SVar10 == STATE_DATA) {
    SVar10 = STATE_DATA;
    if (1 < uVar15 + 1) {
      SVar16 = STATE_TAG;
      if (uVar15 != 0x3c) {
        if (uVar15 != 0x26) goto LAB_0011accd;
        SVar16 = STATE_ENTITY;
      }
      this->m_state = SVar16;
      SVar10 = SVar16;
    }
    if (0 < (int)uVar12) {
      this->m_curToken = TOKEN_DATA;
      return;
    }
    if (uVar15 + 1 < 2) {
      return;
    }
  }
  if (uVar12 == 0) {
    while ((uVar15 < 0x21 && ((0x100002600U >> ((ulong)uVar15 & 0x3f) & 1) != 0))) {
      uVar3 = (long)((int)uVar6 + 1) % (long)iVar11;
      uVar6 = uVar3 & 0xffffffff;
      iVar8 = (int)uVar3;
      (this->m_buf).m_back = iVar8;
      iVar7 = iVar7 + -1;
      (this->m_buf).m_numElements = iVar7;
      uVar15 = 0xffffffff;
      if (0 < iVar7) {
        uVar15 = (uint)puVar14[iVar8];
      }
    }
  }
  if (uVar15 == 0xffffffff) {
    return;
  }
  if (uVar15 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Unexpected end of string","")
    ;
    error(pTVar13,&local_50);
LAB_0011aebe:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pTVar13,"Could not parse special token","");
    error(pTVar13,&local_50);
LAB_0011aee9:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Invalid comment start","");
    error(pTVar13,&local_50);
LAB_0011af14:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Invalid entity","");
    error(pTVar13,&local_50);
LAB_0011af3f:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Unexpected character","");
    error(pTVar13,&local_50);
LAB_0011af6a:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Mismatched quote","");
    error(pTVar13,&local_50);
LAB_0011af95:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pTVar13,"Invalid processing instruction end","");
    error(pTVar13,&local_50);
LAB_0011afc0:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pTVar13 = (Tokenizer *)&local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pTVar13,"Invalid empty element end","");
    error(pTVar13,&local_50);
LAB_0011afeb:
    pTVar13 = (Tokenizer *)&local_50;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pTVar13,"Invalid comment end","");
    error(pTVar13,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (uVar12 == 0) {
    SVar10 = STATE_VALUE;
    if (((uVar15 != 0x22) && (uVar15 != 0x27)) &&
       (SVar10 = STATE_IDENTIFIER, 0x19 < (uVar15 & 0xffffffdf) - 0x41)) {
      SVar10 = STATE_TAG;
      switch(uVar15) {
      case 0x3c:
      case 0x3f:
        break;
      case 0x3d:
        uVar5 = 0x10000000c;
        goto LAB_0011ad9b;
      case 0x3e:
        uVar5 = 0x100000007;
        goto LAB_0011ad9b;
      default:
        SVar9 = SVar16;
        if (uVar15 == 0x26) goto LAB_0011accd;
        if (uVar15 != 0x2f) goto LAB_0011af3f;
      }
    }
switchD_0011ac2f_caseD_3c:
    this->m_state = SVar10;
    SVar9 = SVar10;
  }
  else {
    iVar8 = (int)uVar6;
    switch(SVar16) {
    case STATE_IDENTIFIER:
      SVar9 = STATE_IDENTIFIER;
      if ((((9 < uVar15 - 0x30) && (0x19 < (uVar15 & 0xffffffdf) - 0x41)) && (uVar15 != 0x2d)) &&
         (uVar15 != 0x5f)) {
        this->m_curToken = TOKEN_IDENTIFIER;
        return;
      }
      break;
    case STATE_VALUE:
      if ((uVar15 == 0x27) || (SVar9 = STATE_VALUE, uVar15 == 0x22)) {
        if (iVar7 < 1) {
          uVar4 = 0xffffffff;
        }
        else {
          uVar4 = (uint)puVar14[iVar8 % iVar11];
        }
        if (uVar15 == uVar4) {
          this->m_curToken = TOKEN_STRING;
          goto LAB_0011ae6b;
        }
        goto LAB_0011af6a;
      }
      break;
    case STATE_COMMENT:
      if ((int)uVar12 < 4) {
        SVar9 = STATE_COMMENT;
        if (uVar15 == 0x2d) break;
        goto LAB_0011aee9;
      }
      if (uVar12 < 6) {
        SVar9 = STATE_COMMENT;
        if (uVar12 == 4) break;
LAB_0011ad20:
        bVar17 = false;
      }
      else {
        if (iVar7 <= (int)(uVar12 - 2)) goto LAB_0011ad20;
        bVar17 = puVar14[(int)((uVar12 - 2) + iVar8) % iVar11] == '-';
      }
      SVar9 = STATE_COMMENT;
      if (((int)uVar12 <= iVar7) && (bVar17 && puVar14[(int)(uVar12 + iVar8 + -1) % iVar11] == '-'))
      {
        if (uVar15 == 0x3e) {
          this->m_curToken = TOKEN_COMMENT;
LAB_0011ae6b:
          this->m_curTokenLen = uVar12 + 1;
          return;
        }
        goto LAB_0011afeb;
      }
      break;
    case STATE_ENTITY:
      SVar9 = STATE_ENTITY;
      if (0 < (int)uVar12) {
        if (uVar15 == 0x3b) {
          this->m_curToken = TOKEN_ENTITY;
          goto LAB_0011ae6b;
        }
        if ((9 < uVar15 - 0x30) && (0x19 < (uVar15 & 0xffffffdf) - 0x41)) goto LAB_0011af14;
      }
      break;
    default:
      if ((int)(uVar12 - 1) < iVar7) {
        uVar1 = puVar14[(int)((uVar12 - 1) + iVar8) % iVar11];
        if (uVar1 == '<') {
          SVar10 = STATE_COMMENT;
          if (uVar15 == 0x21) goto switchD_0011ac2f_caseD_3c;
          if (uVar15 == 0x3f) {
            uVar5 = 0x20000000a;
          }
          else if (uVar15 == 0x2f) {
            uVar5 = 0x200000008;
          }
          else {
            uVar5 = 0x100000006;
          }
          goto LAB_0011ad9b;
        }
        if (uVar1 == '/') {
          if (uVar15 != 0x3e) goto LAB_0011afc0;
          uVar5 = 0x200000009;
        }
        else {
          if (uVar1 != '?') goto LAB_0011aebe;
          if (uVar15 != 0x3e) goto LAB_0011af95;
          uVar5 = 0x20000000b;
        }
        goto LAB_0011ad9b;
      }
      goto LAB_0011aebe;
    }
  }
LAB_0011accd:
  uVar12 = uVar12 + 1;
  this->m_curTokenLen = uVar12;
  uVar15 = 0xffffffff;
  if ((int)uVar12 < iVar7) {
    uVar15 = (uint)puVar14[(int)((int)uVar6 + uVar12) % iVar11];
  }
  goto LAB_0011aaf3;
}

Assistant:

void Tokenizer::advance (void)
{
	if (m_curToken != TOKEN_INCOMPLETE)
	{
		// Parser should not try to advance beyond end of string.
		DE_ASSERT(m_curToken != TOKEN_END_OF_STRING);

		// If current token is tag end, change state to data.
		if (m_curToken == TOKEN_TAG_END						||
			m_curToken == TOKEN_EMPTY_ELEMENT_END			||
			m_curToken == TOKEN_PROCESSING_INSTRUCTION_END	||
			m_curToken == TOKEN_COMMENT						||
			m_curToken == TOKEN_ENTITY)
			m_state = STATE_DATA;

		// Advance buffer by length of last token.
		m_buf.popBack(m_curTokenLen);

		// Reset state.
		m_curToken		= TOKEN_INCOMPLETE;
		m_curTokenLen	= 0;

		// If we hit end of string here, report it as end of string.
		if (getChar(0) == END_OF_STRING)
		{
			m_curToken		= TOKEN_END_OF_STRING;
			m_curTokenLen	= 1;
			return;
		}
	}

	int curChar = getChar(m_curTokenLen);

	for (;;)
	{
		if (m_state == STATE_DATA)
		{
			// Advance until we hit end of buffer or tag start and treat that as data token.
			if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER || curChar == '<' || curChar == '&')
			{
				if (curChar == '<')
					m_state = STATE_TAG;
				else if (curChar == '&')
					m_state = STATE_ENTITY;

				if (m_curTokenLen > 0)
				{
					// Report data token.
					m_curToken = TOKEN_DATA;
					return;
				}
				else if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER)
				{
					// Just return incomplete token, no data parsed.
					return;
				}
				else
				{
					DE_ASSERT(m_state == STATE_TAG || m_state == STATE_ENTITY);
					continue;
				}
			}
		}
		else
		{
			// Eat all whitespace if present.
			if (m_curTokenLen == 0)
			{
				while (isWhitespaceChar(curChar))
				{
					m_buf.popBack();
					curChar = getChar(0);
				}
			}

			// Handle end of string / buffer.
			if (curChar == END_OF_STRING)
				error("Unexpected end of string");
			else if (curChar == (int)END_OF_BUFFER)
			{
				DE_ASSERT(m_curToken == TOKEN_INCOMPLETE);
				return;
			}

			if (m_curTokenLen == 0)
			{
				// Expect start of identifier, value or special tag token.
				if (curChar == '\'' || curChar == '"')
					m_state = STATE_VALUE;
				else if (isIdentifierStartChar(curChar))
					m_state = STATE_IDENTIFIER;
				else if (curChar == '<' || curChar == '?' || curChar == '/')
					m_state = STATE_TAG;
				else if (curChar == '&')
					DE_ASSERT(m_state == STATE_ENTITY);
				else if (curChar == '=')
				{
					m_curToken		= TOKEN_EQUAL;
					m_curTokenLen	= 1;
					return;
				}
				else if (curChar == '>')
				{
					m_curToken		= TOKEN_TAG_END;
					m_curTokenLen	= 1;
					return;
				}
				else
					error("Unexpected character");
			}
			else if (m_state == STATE_IDENTIFIER)
			{
				if (!isIdentifierChar(curChar))
				{
					m_curToken = TOKEN_IDENTIFIER;
					return;
				}
			}
			else if (m_state == STATE_VALUE)
			{
				// \todo [2012-06-07 pyry] Escapes.
				if (curChar == '\'' || curChar == '"')
				{
					// \todo [2012-10-17 pyry] Should we actually do the check against getChar(0)?
					if (curChar != getChar(0))
						error("Mismatched quote");
					m_curToken		 = TOKEN_STRING;
					m_curTokenLen	+= 1;
					return;
				}
			}
			else if (m_state == STATE_COMMENT)
			{
				DE_ASSERT(m_curTokenLen >= 2); // 2 characters have been parsed if we are in comment state.

				if (m_curTokenLen <= 3)
				{
					if (curChar != '-')
						error("Invalid comment start");
				}
				else
				{
					int prev2 = m_curTokenLen > 5 ? getChar(m_curTokenLen-2) : 0;
					int prev1 = m_curTokenLen > 4 ? getChar(m_curTokenLen-1) : 0;

					if (prev2 == '-' && prev1 == '-')
					{
						if (curChar != '>')
							error("Invalid comment end");
						m_curToken		 = TOKEN_COMMENT;
						m_curTokenLen	+= 1;
						return;
					}
				}
			}
			else if (m_state == STATE_ENTITY)
			{
				if (m_curTokenLen >= 1)
				{
					if (curChar == ';')
					{
						m_curToken		 = TOKEN_ENTITY;
						m_curTokenLen	+= 1;
						return;
					}
					else if (!de::inRange<int>(curChar, '0', '9')	&&
							 !de::inRange<int>(curChar, 'a', 'z')	&&
							 !de::inRange<int>(curChar, 'A', 'Z'))
						error("Invalid entity");
				}
			}
			else
			{
				// Special tokens are at most 2 characters.
				DE_ASSERT(m_state == STATE_TAG && m_curTokenLen == 1);

				int prevChar = getChar(m_curTokenLen-1);

				if (prevChar == '<')
				{
					// Tag start.
					if (curChar == '/')
					{
						m_curToken		= TOKEN_END_TAG_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '?')
					{
						m_curToken		= TOKEN_PROCESSING_INSTRUCTION_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '!')
					{
						m_state = STATE_COMMENT;
					}
					else
					{
						m_curToken		= TOKEN_TAG_START;
						m_curTokenLen	= 1;
						return;
					}
				}
				else if (prevChar == '?')
				{
					if (curChar != '>')
						error("Invalid processing instruction end");
					m_curToken		= TOKEN_PROCESSING_INSTRUCTION_END;
					m_curTokenLen	= 2;
					return;
				}
				else if (prevChar == '/')
				{
					if (curChar != '>')
						error("Invalid empty element end");
					m_curToken		= TOKEN_EMPTY_ELEMENT_END;
					m_curTokenLen	= 2;
					return;
				}
				else
					error("Could not parse special token");
			}
		}

		m_curTokenLen	+= 1;
		curChar			 = getChar(m_curTokenLen);
	}
}